

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Module * sqlite3VtabCreateModule
                   (sqlite3 *db,char *zName,sqlite3_module *pModule,void *pAux,
                   _func_void_void_ptr *xDestroy)

{
  int iVar1;
  Module *pKey;
  void *p;
  char *zCopy;
  Module *pDel;
  Module *pMStack_38;
  int nName;
  Module *pMod;
  _func_void_void_ptr *xDestroy_local;
  void *pAux_local;
  sqlite3_module *pModule_local;
  char *zName_local;
  sqlite3 *db_local;
  
  iVar1 = sqlite3Strlen30(zName);
  pMStack_38 = (Module *)sqlite3DbMallocRawNN(db,(long)iVar1 + 0x29);
  if (pMStack_38 != (Module *)0x0) {
    pKey = pMStack_38 + 1;
    memcpy(pKey,zName,(long)(iVar1 + 1));
    pMStack_38->zName = (char *)pKey;
    pMStack_38->pModule = pModule;
    pMStack_38->pAux = pAux;
    pMStack_38->xDestroy = xDestroy;
    pMStack_38->pEpoTab = (Table *)0x0;
    p = sqlite3HashInsert(&db->aModule,(char *)pKey,pMStack_38);
    if (p != (void *)0x0) {
      sqlite3OomFault(db);
      sqlite3DbFree(db,p);
      pMStack_38 = (Module *)0x0;
    }
  }
  return pMStack_38;
}

Assistant:

SQLITE_PRIVATE Module *sqlite3VtabCreateModule(
  sqlite3 *db,                    /* Database in which module is registered */
  const char *zName,              /* Name assigned to this module */
  const sqlite3_module *pModule,  /* The definition of the module */
  void *pAux,                     /* Context pointer for xCreate/xConnect */
  void (*xDestroy)(void *)        /* Module destructor function */
){
  Module *pMod;
  int nName = sqlite3Strlen30(zName);
  pMod = (Module *)sqlite3DbMallocRawNN(db, sizeof(Module) + nName + 1);
  if( pMod ){
    Module *pDel;
    char *zCopy = (char *)(&pMod[1]);
    memcpy(zCopy, zName, nName+1);
    pMod->zName = zCopy;
    pMod->pModule = pModule;
    pMod->pAux = pAux;
    pMod->xDestroy = xDestroy;
    pMod->pEpoTab = 0;
    pDel = (Module *)sqlite3HashInsert(&db->aModule,zCopy,(void*)pMod);
    assert( pDel==0 || pDel==pMod );
    if( pDel ){
      sqlite3OomFault(db);
      sqlite3DbFree(db, pDel);
      pMod = 0;
    }
  }
  return pMod;
}